

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O2

void __thiscall
JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>::
MRURetentionPolicy(MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler> *this,
                  Recycler *allocator)

{
  Recycler *alloc;
  CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *this_00;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  (this->store).ptr = (CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *)0x0
  ;
  local_40 = (undefined1  [8])
             &CircularBuffer<Js::EvalMapStringInternal<false>,15u,Memory::Recycler>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2cdd396;
  data.filename._0_4_ = 0x66;
  alloc = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_40);
  this_00 = (CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *)
            new<Memory::Recycler>(0x260,alloc,0x37ff80);
  CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler>::CircularBuffer(this_00);
  Memory::
  WriteBarrierPtr<JsUtil::CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler>_>
  ::WriteBarrierSet(&this->store,this_00);
  return;
}

Assistant:

MRURetentionPolicy(TAllocator* allocator)
        {
            store = AllocatorNew(TAllocator, allocator, TMRUStoreType);
        }